

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O3

string * __thiscall
SWDAnalyzerResults::GetSampleTimeStr_abi_cxx11_
          (string *__return_storage_ptr__,SWDAnalyzerResults *this,S64 sample)

{
  uint uVar1;
  ulonglong uVar2;
  size_t sVar3;
  char time_str [128];
  char acStack_a8 [136];
  
  uVar2 = Analyzer::GetTriggerSample();
  uVar1 = Analyzer::GetSampleRate();
  AnalyzerHelpers::GetTimeString(sample,uVar2,uVar1,acStack_a8,0x80);
  sVar3 = strlen(acStack_a8);
  if (7 < (int)sVar3) {
    acStack_a8[(int)sVar3 - 7] = '\0';
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(acStack_a8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_a8,acStack_a8 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string SWDAnalyzerResults::GetSampleTimeStr( S64 sample ) const
{
    char time_str[ 128 ];
    AnalyzerHelpers::GetTimeString( sample, mAnalyzer->GetTriggerSample(), mAnalyzer->GetSampleRate(), time_str, sizeof( time_str ) );

    // remove trailing zeros
    int l = strlen( time_str );
    if( l > 7 )
        time_str[ l - 7 ] = '\0';

    return time_str;
}